

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O0

double __thiscall
duckdb::Interpolator<false>::Interpolate<unsigned_long,double,duckdb::QuantileIndirect<int>>
          (Interpolator<false> *this,unsigned_long lidx,unsigned_long hidx,Vector *result,
          QuantileIndirect<int> *accessor)

{
  CURSOR *pCVar1;
  long in_RDX;
  long in_RSI;
  QuantileIndirect<int> *in_RDI;
  undefined1 auVar2 [16];
  double hi;
  double lo;
  Vector *in_stack_ffffffffffffff98;
  double local_50;
  RESULT_TYPE_conflict1 local_44;
  double local_40;
  RESULT_TYPE_conflict1 local_34;
  double local_8;
  
  if (in_RSI == in_RDX) {
    local_34 = QuantileIndirect<int>::operator()(in_RDI,(INPUT_TYPE *)in_stack_ffffffffffffff98);
    local_8 = CastInterpolation::Cast<int,double>((int *)in_RDI,in_stack_ffffffffffffff98);
  }
  else {
    local_44 = QuantileIndirect<int>::operator()(in_RDI,(INPUT_TYPE *)in_stack_ffffffffffffff98);
    local_40 = CastInterpolation::Cast<int,double>((int *)in_RDI,in_stack_ffffffffffffff98);
    QuantileIndirect<int>::operator()(in_RDI,(INPUT_TYPE *)in_stack_ffffffffffffff98);
    local_50 = CastInterpolation::Cast<int,double>((int *)in_RDI,in_stack_ffffffffffffff98);
    pCVar1 = in_RDI[2].data;
    auVar2._8_4_ = (int)((ulong)pCVar1 >> 0x20);
    auVar2._0_8_ = pCVar1;
    auVar2._12_4_ = 0x45300000;
    local_8 = CastInterpolation::Interpolate<double>
                        (&local_40,
                         (double)in_RDI[1].data -
                         ((auVar2._8_8_ - 1.9342813113834067e+25) +
                         ((double)CONCAT44(0x43300000,(int)pCVar1) - 4503599627370496.0)),&local_50)
    ;
  }
  return local_8;
}

Assistant:

TARGET_TYPE Interpolate(INPUT_TYPE lidx, INPUT_TYPE hidx, Vector &result, const ACCESSOR &accessor) const {
		using ACCESS_TYPE = typename ACCESSOR::RESULT_TYPE;
		if (lidx == hidx) {
			return CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(lidx), result);
		} else {
			auto lo = CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(lidx), result);
			auto hi = CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(hidx), result);
			return CastInterpolation::Interpolate<TARGET_TYPE>(lo, RN - FRN, hi);
		}
	}